

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O3

char_class_type
boost::xpressive::cpp_regex_traits<char>::
lookup_classname_impl_<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 end)

{
  char cVar1;
  long lVar2;
  undefined1 *puVar3;
  char *pcVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  
  pcVar4 = "alnum";
  lVar2 = 0;
  puVar3 = char_class(unsigned_long)::s_char_class_map;
  do {
    cVar1 = *pcVar4;
    _Var5._M_current = begin._M_current;
    while (cVar1 != '\0') {
      pcVar4 = pcVar4 + 1;
      if ((_Var5._M_current == end._M_current) || (cVar1 != *_Var5._M_current)) goto LAB_001255b3;
      _Var5._M_current = _Var5._M_current + 1;
      cVar1 = *pcVar4;
    }
    if (_Var5._M_current == end._M_current) {
      return *(char_class_type *)(puVar3 + 8);
    }
LAB_001255b3:
    lVar2 = lVar2 + 1;
    puVar3 = char_class(unsigned_long)::s_char_class_map + lVar2 * 0x10;
    pcVar4 = *(char **)(char_class(unsigned_long)::s_char_class_map + lVar2 * 0x10);
    if (lVar2 == 0x10) {
      return 0;
    }
  } while( true );
}

Assistant:

static char_class_type lookup_classname_impl_(FwdIter begin, FwdIter end)
    {
        // find the classname
        typedef cpp_regex_traits<Char> this_t;
        for(std::size_t j = 0; 0 != this_t::char_class(j).class_name_; ++j)
        {
            if(this_t::compare_(this_t::char_class(j).class_name_, begin, end))
            {
                return this_t::char_class(j).class_type_;
            }
        }
        return 0;
    }